

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlGetNamespace(xmlParserCtxtPtr ctxt,xmlChar *prefix)

{
  int iVar1;
  int local_24;
  int i;
  xmlChar *prefix_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (prefix == ctxt->str_xml) {
    ctxt_local = (xmlParserCtxtPtr)ctxt->str_xml_ns;
  }
  else {
    local_24 = ctxt->nsNr;
    do {
      iVar1 = local_24;
      local_24 = iVar1 + -2;
      if (local_24 < 0) {
        return (xmlChar *)0x0;
      }
    } while (ctxt->nsTab[local_24] != prefix);
    if ((prefix == (xmlChar *)0x0) && (*ctxt->nsTab[iVar1 + -1] == '\0')) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlParserCtxtPtr)ctxt->nsTab[iVar1 + -1];
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
xmlGetNamespace(xmlParserCtxtPtr ctxt, const xmlChar *prefix) {
    int i;

    if (prefix == ctxt->str_xml) return(ctxt->str_xml_ns);
    for (i = ctxt->nsNr - 2;i >= 0;i-=2)
        if (ctxt->nsTab[i] == prefix) {
	    if ((prefix == NULL) && (*ctxt->nsTab[i + 1] == 0))
	        return(NULL);
	    return(ctxt->nsTab[i + 1]);
	}
    return(NULL);
}